

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3OsOpenMalloc(sqlite3_vfs *pVfs,char *zFile,sqlite3_file **ppFile,int flags,int *pOutFlags
                       )

{
  void *pvVar1;
  undefined4 in_ECX;
  char *in_RDX;
  sqlite3_vfs *in_RSI;
  undefined8 in_R8;
  int flags_00;
  sqlite3_file *pFile;
  int rc;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffe0;
  
  flags_00 = (int)((ulong)in_R8 >> 0x20);
  iVar2 = 7;
  pvVar1 = sqlite3MallocZero(CONCAT44(7,in_stack_ffffffffffffffd0));
  if (pvVar1 != (void *)0x0) {
    iVar2 = sqlite3OsOpen(in_RSI,in_RDX,(sqlite3_file *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                          flags_00,(int *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
    if (iVar2 == 0) {
      *(void **)in_RDX = pvVar1;
    }
    else {
      sqlite3_free((void *)0x13b73d);
    }
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3OsOpenMalloc(
  sqlite3_vfs *pVfs, 
  const char *zFile, 
  sqlite3_file **ppFile, 
  int flags,
  int *pOutFlags
){
  int rc = SQLITE_NOMEM;
  sqlite3_file *pFile;
  pFile = (sqlite3_file *)sqlite3MallocZero(pVfs->szOsFile);
  if( pFile ){
    rc = sqlite3OsOpen(pVfs, zFile, pFile, flags, pOutFlags);
    if( rc!=SQLITE_OK ){
      sqlite3_free(pFile);
    }else{
      *ppFile = pFile;
    }
  }
  return rc;
}